

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::InsertEdgeIntoAEL(Clipper *this,TEdge *edge,TEdge *startEdge)

{
  bool bVar1;
  byte local_29;
  TEdge *local_20;
  TEdge *startEdge_local;
  TEdge *edge_local;
  Clipper *this_local;
  
  if (*(long *)(this->_vptr_Clipper[-3] + 0x10 +
               (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) == 0
     ) {
    edge->PrevInAEL = (TEdge *)0x0;
    edge->NextInAEL = (TEdge *)0x0;
    *(TEdge **)
     (this->_vptr_Clipper[-3] + 0x10 +
     (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) = edge;
  }
  else if ((startEdge == (TEdge *)0x0) &&
          (bVar1 = E2InsertsBeforeE1(*(TEdge **)
                                      (this->_vptr_Clipper[-3] + 0x10 +
                                      (long)&(this->m_Maxima).
                                             super__List_base<long_long,_std::allocator<long_long>_>
                                      ),edge), bVar1)) {
    edge->PrevInAEL = (TEdge *)0x0;
    edge->NextInAEL =
         *(TEdge **)
          (this->_vptr_Clipper[-3] + 0x10 +
          (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
    *(TEdge **)
     (*(long *)(this->_vptr_Clipper[-3] + 0x10 +
               (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) +
     0x70) = edge;
    *(TEdge **)
     (this->_vptr_Clipper[-3] + 0x10 +
     (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) = edge;
  }
  else {
    local_20 = startEdge;
    if (startEdge == (TEdge *)0x0) {
      local_20 = *(TEdge **)
                  (this->_vptr_Clipper[-3] + 0x10 +
                  (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
    }
    while( true ) {
      local_29 = 0;
      if (local_20->NextInAEL != (TEdge *)0x0) {
        bVar1 = E2InsertsBeforeE1(local_20->NextInAEL,edge);
        local_29 = bVar1 ^ 0xff;
      }
      if ((local_29 & 1) == 0) break;
      local_20 = local_20->NextInAEL;
    }
    edge->NextInAEL = local_20->NextInAEL;
    if (local_20->NextInAEL != (TEdge *)0x0) {
      local_20->NextInAEL->PrevInAEL = edge;
    }
    edge->PrevInAEL = local_20;
    local_20->NextInAEL = edge;
  }
  return;
}

Assistant:

void Clipper::InsertEdgeIntoAEL(TEdge *edge, TEdge* startEdge)
{
  if(!m_ActiveEdges)
  {
    edge->PrevInAEL = 0;
    edge->NextInAEL = 0;
    m_ActiveEdges = edge;
  }
  else if(!startEdge && E2InsertsBeforeE1(*m_ActiveEdges, *edge))
  {
      edge->PrevInAEL = 0;
      edge->NextInAEL = m_ActiveEdges;
      m_ActiveEdges->PrevInAEL = edge;
      m_ActiveEdges = edge;
  } 
  else
  {
    if(!startEdge) startEdge = m_ActiveEdges;
    while(startEdge->NextInAEL  && 
      !E2InsertsBeforeE1(*startEdge->NextInAEL , *edge))
        startEdge = startEdge->NextInAEL;
    edge->NextInAEL = startEdge->NextInAEL;
    if(startEdge->NextInAEL) startEdge->NextInAEL->PrevInAEL = edge;
    edge->PrevInAEL = startEdge;
    startEdge->NextInAEL = edge;
  }
}